

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O3

uint64_t helper_iwmmxt_rorw_arm(CPUARMState *env,uint64_t x,uint32_t n)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  bVar1 = (byte)n;
  bVar2 = 0x10 - bVar1;
  uVar6 = x << (bVar2 & 0x3f) & 0xffff | (x & 0xffff) >> (bVar1 & 0x3f);
  uVar4 = (uint)x & 0xffff0000;
  uVar4 = uVar4 << (bVar2 & 0x3f) | uVar4 >> (bVar1 & 0x3f);
  uVar8 = (ulong)(uVar4 & 0xffff0000);
  uVar5 = (x & 0xffff00000000) << (bVar2 & 0x3f) | (x & 0xffff00000000) >> (bVar1 & 0x3f);
  uVar7 = uVar5 & 0xffff00000000;
  uVar3 = (x & 0xffff000000000000) >> (bVar1 & 0x3f) & 0xffff000000000000 |
          (x & 0xffff000000000000) << (bVar2 & 0x3f);
  (env->iwmmxt).cregs[3] =
       (uint)(uVar3 == 0) << 0x1e | (uint)(0x7fff000000000000 < uVar3) << 0x1f |
       (uint)(uVar6 == 0) << 6 | (uint)(0x7fff < uVar6) << 7 | uVar4 >> 0x10 & 0x8000 |
       (uint)(uVar8 == 0) << 0xe | (uint)(uVar5 >> 0x18) & 0x800000 | (uint)(uVar7 == 0) << 0x16;
  return uVar7 + uVar3 | uVar8 | uVar6;
}

Assistant:

uint64_t HELPER(iwmmxt_rorw)(CPUARMState *env, uint64_t x, uint32_t n)
{
    x = ((((x & (0xffffll << 0)) >> n) |
          ((x & (0xffffll << 0)) << (16 - n))) & (0xffffll << 0)) |
        ((((x & (0xffffll << 16)) >> n) |
          ((x & (0xffffll << 16)) << (16 - n))) & (0xffffll << 16)) |
        ((((x & (0xffffll << 32)) >> n) |
          ((x & (0xffffll << 32)) << (16 - n))) & (0xffffll << 32)) |
        ((((x & (0xffffll << 48)) >> n) |
          ((x & (0xffffll << 48)) << (16 - n))) & (0xffffll << 48));
    env->iwmmxt.cregs[ARM_IWMMXT_wCASF] =
        NZBIT16(x >> 0, 0) | NZBIT16(x >> 16, 1) |
        NZBIT16(x >> 32, 2) | NZBIT16(x >> 48, 3);
    return x;
}